

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  int iVar1;
  long lVar2;
  undefined2 *puVar3;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  float out_w;
  float out_h;
  float out_stride;
  float scale_x;
  stbrp_coord pad;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  int lsb;
  int advance;
  stbtt_packedchar *bc;
  stbrp_rect *r;
  float sub_y;
  float sub_x;
  float recip_v;
  float recip_h;
  float scale;
  float fh;
  int old_v_over;
  int old_h_over;
  int return_value;
  int k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  short in_stack_ffffffffffffff76;
  float glyph_index;
  uint in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  int unicode_codepoint;
  int iVar7;
  int iVar8;
  int local_30;
  int local_2c;
  
  iVar7 = 1;
  unicode_codepoint = *(int *)(in_RDI + 0x24);
  uVar6 = *(undefined4 *)(in_RDI + 0x28);
  iVar8 = 0;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    fVar5 = *(float *)(in_RDX + (long)local_2c * 0x28);
    if (fVar5 <= 0.0) {
      in_stack_ffffffffffffff70 =
           stbtt_ScaleForMappingEmToPixels
                     ((stbtt_fontinfo *)
                      CONCAT26(in_stack_ffffffffffffff76,
                               CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                      in_stack_ffffffffffffff6c);
    }
    else {
      in_stack_ffffffffffffff70 =
           stbtt_ScaleForPixelHeight
                     ((stbtt_fontinfo *)
                      CONCAT26(in_stack_ffffffffffffff76,
                               CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                      in_stack_ffffffffffffff6c);
    }
    *(uint *)(in_RDI + 0x24) = (uint)*(byte *)(in_RDX + 0x20 + (long)local_2c * 0x28);
    *(uint *)(in_RDI + 0x28) = (uint)*(byte *)(in_RDX + 0x21 + (long)local_2c * 0x28);
    out_w = 1.0 / (float)*(uint *)(in_RDI + 0x24);
    out_h = 1.0 / (float)*(uint *)(in_RDI + 0x28);
    fVar4 = in_stack_ffffffffffffff70;
    out_stride = stbtt__oversample_shift(*(int *)(in_RDI + 0x24));
    scale_x = stbtt__oversample_shift(*(int *)(in_RDI + 0x28));
    for (local_30 = 0; local_30 < *(int *)(in_RDX + (long)local_2c * 0x28 + 0x10);
        local_30 = local_30 + 1) {
      lVar2 = in_R8 + (long)iVar8 * 0x10;
      if (((*(int *)(lVar2 + 0xc) == 0) || (*(short *)(lVar2 + 4) == 0)) ||
         (*(short *)(lVar2 + 6) == 0)) {
        iVar7 = 0;
      }
      else {
        puVar3 = (undefined2 *)
                 (*(long *)(in_RDX + (long)local_2c * 0x28 + 0x18) + (long)local_30 * 0x1c);
        if (*(long *)(in_RDX + (long)local_2c * 0x28 + 8) == 0) {
          in_stack_ffffffffffffff6c =
               (float)(*(int *)(in_RDX + (long)local_2c * 0x28 + 4) + local_30);
        }
        else {
          in_stack_ffffffffffffff6c =
               *(float *)(*(long *)(in_RDX + (long)local_2c * 0x28 + 8) + (long)local_30 * 4);
        }
        glyph_index = in_stack_ffffffffffffff6c;
        iVar1 = stbtt_FindGlyphIndex((stbtt_fontinfo *)CONCAT44(iVar8,iVar7),unicode_codepoint);
        in_stack_ffffffffffffff76 = *(short *)(in_RDI + 0x1c);
        *(short *)(lVar2 + 8) = (short)*(undefined4 *)(lVar2 + 8) + in_stack_ffffffffffffff76;
        *(short *)(lVar2 + 10) = *(short *)(lVar2 + 10) + in_stack_ffffffffffffff76;
        *(short *)(lVar2 + 4) = (short)*(undefined4 *)(lVar2 + 4) - in_stack_ffffffffffffff76;
        *(short *)(lVar2 + 6) = *(short *)(lVar2 + 6) - in_stack_ffffffffffffff76;
        stbtt_GetGlyphHMetrics
                  ((stbtt_fontinfo *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (int)glyph_index,
                   (int *)CONCAT26(in_stack_ffffffffffffff76,
                                   CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                   (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        stbtt_GetGlyphBitmapBox
                  ((stbtt_fontinfo *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                   (int *)CONCAT44(glyph_index,iVar1),
                   (int *)CONCAT26(in_stack_ffffffffffffff76,
                                   CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                   (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (int *)0x207a97);
        stbtt_MakeGlyphBitmapSubpixel
                  ((stbtt_fontinfo *)CONCAT44(unicode_codepoint,uVar6),
                   (uchar *)CONCAT44(fVar5,fVar4),(int)out_w,(int)out_h,(int)out_stride,scale_x,
                   (float)((ulong)lVar2 >> 0x20),(float)lVar2,(float)((ulong)puVar3 >> 0x20),
                   (int)puVar3);
        if (1 < *(uint *)(in_RDI + 0x24)) {
          stbtt__h_prefilter((uchar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff8c,(int)in_stack_ffffffffffffff88,
                             (int)in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
        }
        if (1 < *(uint *)(in_RDI + 0x28)) {
          stbtt__v_prefilter((uchar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff8c,(int)in_stack_ffffffffffffff88,
                             (int)in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
        }
        *puVar3 = *(undefined2 *)(lVar2 + 8);
        puVar3[1] = *(undefined2 *)(lVar2 + 10);
        puVar3[2] = *(short *)(lVar2 + 8) + *(short *)(lVar2 + 4);
        puVar3[3] = *(short *)(lVar2 + 10) + *(short *)(lVar2 + 6);
        *(float *)(puVar3 + 8) = fVar4 * (float)in_stack_ffffffffffffff94;
        *(float *)(puVar3 + 4) = (float)in_stack_ffffffffffffff8c * out_w + out_stride;
        *(float *)(puVar3 + 6) = (float)(int)in_stack_ffffffffffffff88 * out_h + scale_x;
        *(float *)(puVar3 + 10) =
             (float)(int)(in_stack_ffffffffffffff8c + (uint)*(ushort *)(lVar2 + 4)) * out_w +
             out_stride;
        *(float *)(puVar3 + 0xc) =
             (float)(int)((int)in_stack_ffffffffffffff88 + (uint)*(ushort *)(lVar2 + 6)) * out_h +
             scale_x;
      }
      iVar8 = iVar8 + 1;
    }
  }
  *(int *)(in_RDI + 0x24) = unicode_codepoint;
  *(undefined4 *)(in_RDI + 0x28) = uVar6;
  return iVar7;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed && r->w != 0 && r->h != 0) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}